

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_feature_merger.cc
# Opt level: O0

base_learner * VW::shared_feature_merger::shared_feature_merger_setup(options_i *options,vw *all)

{
  bool bVar1;
  base_learner *dat;
  multi_learner *base_00;
  learner<VW::shared_feature_merger::sfm_data,_std::vector<example_*,_std::allocator<example_*>_>_>
  *base_01;
  learner<VW::shared_feature_merger::sfm_data,_std::vector<example_*,_std::allocator<example_*>_>_>
  *learner;
  multi_learner *base;
  free_ptr<VW::shared_feature_merger::sfm_data> data;
  learner<char,_char> *in_stack_00000160;
  _func_void_sfm_data_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
  *in_stack_ffffffffffffff98;
  vw *in_stack_ffffffffffffffa0;
  options_i *in_stack_ffffffffffffffa8;
  options_i *in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  bVar1 = use_reduction(in_stack_ffffffffffffffb8);
  if (bVar1) {
    scoped_calloc_or_throw<VW::shared_feature_merger::sfm_data>();
    dat = setup_base(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    base_00 = LEARNER::as_multiline<char,char>(in_stack_00000160);
    base_01 = LEARNER::
              init_learner<VW::shared_feature_merger::sfm_data,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                        ((free_ptr<VW::shared_feature_merger::sfm_data> *)dat,base_00,
                         (_func_void_sfm_data_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                          *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_8 = LEARNER::
              make_base<VW::shared_feature_merger::sfm_data,std::vector<example*,std::allocator<example*>>>
                        (base_01);
    std::unique_ptr<VW::shared_feature_merger::sfm_data,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<VW::shared_feature_merger::sfm_data,_void_(*)(void_*)> *)dat);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  return local_8;
}

Assistant:

LEARNER::base_learner* shared_feature_merger_setup(config::options_i& options, vw& all)
{
  if (!use_reduction(options))
    return nullptr;

  auto data = scoped_calloc_or_throw<sfm_data>();

  auto* base = LEARNER::as_multiline(setup_base(options, all));
  auto& learner = LEARNER::init_learner(data, base, predict_or_learn<true>, predict_or_learn<false>);

  // TODO: Incorrect feature numbers will be reported without merging the example namespaces from the
  //       shared example in a finish_example function. However, its too expensive to perform the full operation.

  return LEARNER::make_base(learner);
}